

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_error_page<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,czstring cause,http_status_code error_no,czstring shortmsg,czstring longmsg)

{
  anon_class_24_3_4e63f42d f;
  ostream *poVar1;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> text;
  string *str;
  undefined4 in_register_0000008c;
  undefined1 auVar2 [16];
  string content_length;
  string status_line;
  string now;
  array<std::pair<const_char_*,_const_char_*>,_5UL> h;
  ostringstream content;
  http *local_2d0;
  http **local_2c8;
  char **ppcStack_2c0;
  string *local_2b8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  char *local_1f8;
  pointer local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  pointer local_1c0;
  char *local_1b8;
  pointer local_1b0;
  ostringstream local_1a8 [376];
  
  text._M_data = io._M_data;
  str = (string *)cause;
  local_2d0 = this;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,
                           "<!DOCTYPE html>\n<html lang=\"en\"><head>\n<meta charset=\"utf-8\">\n<title>"
                          );
  poVar1 = std::operator<<(poVar1,"pstore-http");
  poVar1 = std::operator<<(poVar1," Error</title>\n</head>\n<body>\n<h1>");
  poVar1 = std::operator<<(poVar1,"pstore-http");
  poVar1 = std::operator<<(poVar1," Web Server Error</h1>\n<p>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)cause);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(char *)CONCAT44(in_register_0000008c,error_no));
  poVar1 = std::operator<<(poVar1,"</p><p>");
  poVar1 = std::operator<<(poVar1,shortmsg);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(char *)io._M_data);
  poVar1 = std::operator<<(poVar1,"</p>\n<hr>\n<em>The ");
  poVar1 = std::operator<<(poVar1,"pstore-http");
  std::operator<<(poVar1," Web server</em>\n</body>\n</html>\n");
  std::__cxx11::stringbuf::str();
  auVar2 = std::chrono::_V2::system_clock::now();
  http_date_abi_cxx11_(&local_238,auVar2._0_8_,(duration)auVar2._8_8_);
  build_status_line_abi_cxx11_
            (&local_258,(http *)((ulong)cause & 0xffffffff),0x125a0d,(czstring)text._M_data);
  std::__cxx11::to_string(&local_278,local_218._M_string_length);
  ppcStack_2c0 = &local_1f8;
  local_1f8 = "Content-length";
  local_1f0 = local_278._M_dataplus._M_p;
  local_1e8 = "Connection";
  local_1e0 = "close";
  local_1d8 = "Content-type";
  local_1d0 = "text/html";
  local_1c8 = "Date";
  local_1c0 = local_238._M_dataplus._M_p;
  local_1b8 = "Last-Modified";
  local_1b0 = local_238._M_dataplus._M_p;
  local_2c8 = &local_2d0;
  local_2b8 = &local_218;
  std::operator+(&local_298,&local_258,"\r\n");
  send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (&local_2b0,this,sender,
             (descriptor<pstore::details::posix_descriptor_traits> *)&local_298,str);
  f.h = (array<std::pair<const_char_*,_const_char_*>,_5UL> *)ppcStack_2c0;
  f.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
              **)local_2c8;
  f.content_str = local_2b8;
  pstore::operator>>=(__return_storage_ptr__,&local_2b0,f);
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  ::~error_or(&local_2b0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_error_page (Sender sender, IO io, gsl::czstring const cause,
                                      http_status_code const error_no, gsl::czstring const shortmsg,
                                      gsl::czstring const longmsg) {
            using status_type = std::underlying_type_t<http_status_code>;
            std::ostringstream content;
            content << "<!DOCTYPE html>\n"
                       "<html lang=\"en\">"
                       "<head>\n"
                       "<meta charset=\"utf-8\">\n"
                       "<title>"
                    << server_name
                    << " Error</title>\n"
                       "</head>\n"
                       "<body>\n"
                       "<h1>"
                    << server_name
                    << " Web Server Error</h1>\n"
                       "<p>"
                    << static_cast<status_type> (error_no) << ": " << shortmsg
                    << "</p>"
                       "<p>"
                    << longmsg << ": " << cause
                    << "</p>\n"
                       "<hr>\n"
                       "<em>The "
                    << server_name
                    << " Web server</em>\n"
                       "</body>\n"
                       "</html>\n";
            std::string const & content_str = content.str ();

            auto const now = http_date (std::chrono::system_clock::now ());
            auto const status_line = build_status_line (error_no, "OK");

            auto const content_length = std::to_string (content_str.length ());
            std::array<czstring_pair, 5> const h{{
                {"Content-length", content_length.c_str ()},
                {"Connection", "close"}, // TODO remove this when we support persistent connections
                {"Content-type", "text/html"},
                {"Date", now.c_str ()},
                {"Last-Modified", now.c_str ()},
            }};

            // Send the three parts: the response line, the headers, and the HTML content.
            return send (sender, io, status_line + crlf) >>= [&] (IO io2) {
                return send (sender, io2, build_headers (std::begin (h), std::end (h))) >>=
                       [&] (IO io3) { return send (sender, io3, content_str); };
            };
        }